

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FrexpCaseInstance::compare
          (FrexpCaseInstance *this,void **inputs,void **outputs)

{
  bool bVar1;
  const_reference pvVar2;
  ostream *poVar3;
  Hex<8UL> HVar4;
  float local_84;
  byte local_71;
  HexFloat local_60;
  float local_5c;
  int local_58;
  deUint32 ulpDiff0;
  int refOut1;
  float refOut0;
  int out1;
  float out0;
  float in0;
  int compNdx;
  deUint32 maxUlpDiff;
  int mantissaBits;
  bool signedZero;
  Precision PStack_30;
  bool transitSupportsSignedZero;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  FrexpCaseInstance *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar2 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar2->varType);
  pvVar2 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  PStack_30 = glu::VarType::getPrecision(&pvVar2->varType);
  mantissaBits = glu::getDataTypeScalarSize(scalarSize);
  maxUlpDiff._3_1_ = (this->super_CommonFunctionTestInstance).m_shaderType != SHADERTYPE_FRAGMENT;
  bVar1 = supportsSignedZero(PStack_30);
  local_71 = 0;
  if (bVar1) {
    local_71 = maxUlpDiff._3_1_;
  }
  maxUlpDiff._2_1_ = local_71 & 1;
  compNdx = getMinMantissaBits(PStack_30);
  in0 = (float)getMaxUlpDiffFromBits(compNdx);
  out0 = 0.0;
  while( true ) {
    if (mantissaBits <= (int)out0) {
      return true;
    }
    out1 = *(uint *)((long)*outputs_local + (long)(int)out0 * 4);
    refOut0 = *(float *)((long)*_precision + (long)(int)out0 * 4);
    refOut1 = *(int *)((long)_precision[1] + (long)(int)out0 * 4);
    frexp((double)(ulong)(uint)out1,(int *)&ulpDiff0);
    if ((maxUlpDiff._2_1_ & 1) == 0) {
      local_84 = (float)getUlpDiffIgnoreZeroSign(refOut0,(float)ulpDiff0);
    }
    else {
      local_84 = (float)getUlpDiff(refOut0,(float)ulpDiff0);
    }
    local_5c = local_84;
    if (((uint)in0 < (uint)local_84) || (refOut1 != local_58)) break;
    out0 = (float)((int)out0 + 1);
  }
  poVar3 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                           "Expected [");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)out0);
  poVar3 = std::operator<<(poVar3,"] = ");
  HexFloat::HexFloat(&local_60,(float)ulpDiff0);
  poVar3 = anon_unknown_0::operator<<(poVar3,&local_60);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_58);
  poVar3 = std::operator<<(poVar3," with ULP threshold ");
  HVar4 = tcu::toHex<unsigned_int>((uint)in0);
  poVar3 = tcu::Format::operator<<(poVar3,HVar4);
  poVar3 = std::operator<<(poVar3,", got ULP diff ");
  HVar4 = tcu::toHex<unsigned_int>((uint)local_5c);
  tcu::Format::operator<<(poVar3,HVar4);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const bool				transitSupportsSignedZero	= (m_shaderType != glu::SHADERTYPE_FRAGMENT); // executor cannot reliably transit negative zero to fragment stage
		const bool				signedZero					= supportsSignedZero(precision) && transitSupportsSignedZero;

		const int				mantissaBits				= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff					= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const int		out1		= ((const int*)outputs[1])[compNdx];

			float			refOut0;
			int				refOut1;

			frexp(in0, &refOut0, &refOut1);

			const deUint32	ulpDiff0	= signedZero ? getUlpDiff(out0, refOut0) : getUlpDiffIgnoreZeroSign(out0, refOut0);

			if (ulpDiff0 > maxUlpDiff || out1 != refOut1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", " << refOut1 << " with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff0);
				return false;
			}
		}

		return true;
	}